

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::WeakFulfiller<void>_>::dispose(Own<kj::_::WeakFulfiller<void>_> *this)

{
  WeakFulfiller<void> *object;
  WeakFulfiller<void> *ptrCopy;
  Own<kj::_::WeakFulfiller<void>_> *this_local;
  
  object = this->ptr;
  if (object != (WeakFulfiller<void> *)0x0) {
    this->ptr = (WeakFulfiller<void> *)0x0;
    Disposer::dispose<kj::_::WeakFulfiller<void>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }